

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest1_2 *this,_variable_type *variable_type,
          uint array_size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  ostream *poVar5;
  size_t sVar6;
  undefined4 in_register_0000000c;
  _variable_type *variable_type_00;
  _variable_type *variable_type_01;
  _variable_type *variable_type_02;
  uint uVar7;
  bool *pbVar8;
  char *pcVar9;
  uint array_index_1;
  uint array_index;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  string variable_type_glsl_as_int;
  uint n_variable_type_components;
  _variable_type result_as_int_variable_type;
  string variable_type_glsl;
  _variable_type result_as_int_variable_type_1;
  stringstream variable_type_glsl_array_sstream;
  stringstream variable_type_glsl_arrayed_sstream;
  stringstream result_sstream;
  string local_550;
  ulong local_530;
  _variable_type local_528;
  uint local_524;
  ulong local_520;
  _variable_type local_518;
  undefined4 uStack_514;
  long local_510;
  long local_508 [2];
  string local_4f8;
  string *local_4d8;
  _variable_type local_4cc;
  stringstream local_4c8 [16];
  undefined1 local_4b8 [376];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_530 = CONCAT44(in_register_0000000c,array_size);
  local_4d8 = __return_storage_ptr__;
  local_528 = Utils::getBaseVariableType(variable_type);
  local_524 = Utils::getNumberOfComponentsForVariableType(variable_type);
  std::__cxx11::stringstream::stringstream(local_1b8);
  Utils::getVariableTypeGLSLString_abi_cxx11_(&local_4f8,(Utils *)variable_type,variable_type_00);
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  local_520 = local_530 & 0xffffffff;
  if (1 < (uint)local_530) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               (char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
               local_550._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_) !=
        &local_550.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
                      local_550.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n",
             0x3c);
  if (*variable_type == VARIABLE_TYPE_DOUBLE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_ARB_gpu_shader_fp64 : require\n",0x2c);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nsubroutine ",0xc);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,
                      (char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,
                                       local_550._M_dataplus._M_p._0_4_),local_550._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," colorGetter(in ",0x10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in_value",9);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)CONCAT44(uStack_514,local_518),local_510);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n\n",4);
  if ((long *)CONCAT44(uStack_514,local_518) != local_508) {
    operator_delete((long *)CONCAT44(uStack_514,local_518),local_508[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_) !=
      &local_550.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
                    local_550.field_2._M_allocated_capacity + 1);
  }
  iVar3 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"subroutine(colorGetter) ",0x18);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,
                                         local_550._M_dataplus._M_p._0_4_),
                        local_550._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," getter",7);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(in ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," in_value",9);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(uStack_514,local_518),local_510);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n{\n",4);
    if ((long *)CONCAT44(uStack_514,local_518) != local_508) {
      operator_delete((long *)CONCAT44(uStack_514,local_518),local_508[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_) !=
        &local_550.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
                      local_550.field_2._M_allocated_capacity + 1);
    }
    if (1 < (uint)local_530) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_4f8._M_dataplus._M_p,local_4f8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," temp",5);
      std::__cxx11::stringbuf::str();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,
                                                  local_550._M_dataplus._M_p._0_4_),
                          local_550._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_) !=
          &local_550.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
                        local_550.field_2._M_allocated_capacity + 1);
      }
    }
    poVar4 = (ostream *)local_1a8;
    if (local_528 == VARIABLE_TYPE_BOOL) {
      if (1 < (uint)local_530) {
        uVar10 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    temp[",9);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
          pbVar8 = glcts::fixed_sample_locations_values + 1;
          if (iVar3 == 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_4f8);
            pbVar8 = (bool *)0x1c2f25f;
            if (iVar2 == 0) {
              pbVar8 = (bool *)0x1b7f98b;
            }
          }
          sVar6 = strlen(pbVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pbVar8,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(in_value[",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]);\n",4);
          uVar10 = uVar10 + 1;
        } while (local_520 != uVar10);
        goto LAB_0097932e;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    return ",0xb);
      pbVar8 = glcts::fixed_sample_locations_values + 1;
      if (iVar3 == 0) {
        iVar2 = std::__cxx11::string::compare((char *)&local_4f8);
        pbVar8 = (bool *)0x1c2f25f;
        if (iVar2 == 0) {
          pbVar8 = (bool *)0x1b7f98b;
        }
      }
      sVar6 = strlen(pbVar8);
      lVar11 = 0xc;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pbVar8,sVar6);
      pcVar9 = "(in_value);\n";
    }
    else if ((uint)local_530 < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    return (in_value + ",0x17);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar3 + 1);
      lVar11 = 3;
      pcVar9 = ");\n";
    }
    else {
      uVar10 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    temp[",9);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = in_value[",0xd);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] + ",4);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
        uVar10 = uVar10 + 1;
      } while (local_520 != uVar10);
LAB_0097932e:
      lVar11 = 0x11;
      pcVar9 = "    return temp;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,lVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    bVar12 = iVar3 == 0;
    iVar3 = iVar3 + 1;
  } while (bVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"subroutine uniform colorGetter colorGetterUniform;\n\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  if (local_528 == VARIABLE_TYPE_BOOL) {
    local_550._M_dataplus._M_p._0_4_ = 9;
    local_518 = Utils::getVariableTypeFromProperties((_variable_type *)&local_550,&local_524);
    Utils::getVariableTypeGLSLString_abi_cxx11_(&local_550,(Utils *)&local_518,variable_type_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
               local_550._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_) !=
        &local_550.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
                      local_550.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," result;\n\n",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main()\n{\n    ",0x12);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," temp",5);
  if (1 < (uint)local_530) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  uVar7 = local_524;
  if ((uint)local_530 != 0) {
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    temp",8);
      if (1 < (uint)local_530) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_4f8._M_dataplus._M_p,local_4f8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
      uVar1 = uVar7;
      if (local_528 == VARIABLE_TYPE_BOOL) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"true",4);
      }
      else {
        for (; uVar1 != 0; uVar1 = uVar1 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"3",1);
          if (uVar1 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_520);
  }
  if (local_528 == VARIABLE_TYPE_BOOL) {
    local_550._M_dataplus._M_p._0_4_ = 9;
    local_4cc = Utils::getVariableTypeFromProperties((_variable_type *)&local_550,&local_524);
    Utils::getVariableTypeGLSLString_abi_cxx11_(&local_550,(Utils *)&local_4cc,variable_type_02);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)CONCAT44(uStack_514,local_518),local_510);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," subroutine_result = colorGetterUniform(temp);\nresult = ",0x38);
    if ((long *)CONCAT44(uStack_514,local_518) != local_508) {
      operator_delete((long *)CONCAT44(uStack_514,local_518),local_508[0] + 1);
    }
    if ((uint)local_530 != 0) {
      uVar7 = (uint)local_530 - 1;
      uVar10 = 0;
      do {
        iVar3 = std::__cxx11::string::compare((char *)&local_4f8);
        pcVar9 = "all(subroutine_result";
        if (iVar3 == 0) {
          pcVar9 = "bool(subroutine_result";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar9,(ulong)(iVar3 == 0) + 0x15);
        if (1 < (uint)local_530) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
        if (uVar7 != uVar10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"&& ",3);
        }
        uVar10 = uVar10 + 1;
      } while (local_520 != uVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," == true ? ",0xb);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,
                                         local_550._M_dataplus._M_p._0_4_),
                        local_550._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(1) : ",6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,
                                                local_550._M_dataplus._M_p._0_4_),
                        local_550._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(0);",4);
  }
  else {
    if ((uint)local_530 < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"result = colorGetterUniform(temp);\n",0x23);
      goto LAB_009798d9;
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," subroutine_result",0x12);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(local_550._M_dataplus._M_p._4_4_,
                                                local_550._M_dataplus._M_p._0_4_),
                        local_550._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               " = colorGetterUniform(temp);\n\nif (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\nelse\nresult = "
               ,0x7d);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(-1);\n",6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_) !=
      &local_550.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_550._M_dataplus._M_p._4_4_,local_550._M_dataplus._M_p._0_4_),
                    local_550.field_2._M_allocated_capacity + 1);
  }
LAB_009798d9:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_4d8;
}

Assistant:

std::string FunctionalTest1_2::getVertexShaderBody(const Utils::_variable_type& variable_type, unsigned int array_size)
{
	Utils::_variable_type base_variable_type		 = Utils::getBaseVariableType(variable_type);
	unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	std::stringstream	 result_sstream;
	std::string			  variable_type_glsl = Utils::getVariableTypeGLSLString(variable_type);
	std::stringstream	 variable_type_glsl_array_sstream;
	std::stringstream	 variable_type_glsl_arrayed_sstream;

	variable_type_glsl_arrayed_sstream << variable_type_glsl;

	if (array_size > 1)
	{
		variable_type_glsl_array_sstream << "[" << array_size << "]";
		variable_type_glsl_arrayed_sstream << variable_type_glsl_array_sstream.str();
	}

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n";

	if (variable_type == Utils::VARIABLE_TYPE_DOUBLE)
	{
		result_sstream << "#extension GL_ARB_gpu_shader_fp64 : require\n";
	}

	/* Form subroutine type declaration */
	result_sstream << "\n"
					  "subroutine "
				   << variable_type_glsl_arrayed_sstream.str() << " colorGetter(in " << variable_type_glsl
				   << " in_value" << variable_type_glsl_array_sstream.str() << ");\n"
																			   "\n";

	/* Declare getter functions */
	for (int n_getter = 0; n_getter < 2; ++n_getter)
	{
		result_sstream << "subroutine(colorGetter) " << variable_type_glsl_arrayed_sstream.str() << " getter"
					   << n_getter << "(in " << variable_type_glsl << " in_value"
					   << variable_type_glsl_array_sstream.str() << ")\n"
																	"{\n";

		if (array_size > 1)
		{
			result_sstream << variable_type_glsl << " temp" << variable_type_glsl_array_sstream.str() << ";\n";
		}

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = "
								   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
								   << "(in_value[" << array_index << "]);\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return "
							   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
							   << "(in_value);\n";
			}
		} /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
		else
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = in_value["
								   << array_index << "] + " << (n_getter + 1) << ";\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return (in_value + " << (n_getter + 1) << ");\n";
			}
		}

		result_sstream << "}\n";
	} /* for (both getter functions) */

	/* Declare subroutine uniform */
	result_sstream << "subroutine uniform colorGetter colorGetterUniform;\n"
					  "\n";

	/* Declare output variable */
	result_sstream << "out ";

	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_as_int;
	}
	else
	{
		result_sstream << variable_type_glsl;
	}

	result_sstream << " result;\n"
					  "\n";

	/* Declare main(): prepare input argument for the subroutine function */
	result_sstream << "void main()\n"
					  "{\n"
					  "    "
				   << variable_type_glsl << " temp";

	if (array_size > 1)
	{
		result_sstream << "[" << array_size << "]";
	};

	result_sstream << ";\n";

	for (unsigned int array_index = 0; array_index < array_size; ++array_index)
	{
		result_sstream << "    temp";

		if (array_size > 1)
		{
			result_sstream << "[" << array_index << "]";
		}

		result_sstream << " = " << variable_type_glsl << "(";

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			result_sstream << "true";
		}
		else
		{
			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << "3";

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			} /* for (all components) */
		}

		result_sstream << ");\n";
	} /* for (all array indices) */

	/* Declare main(): call the subroutine. Verify the input and write the result
	 *                 to the output variable.
	 **/
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_arrayed_sstream.str() << " subroutine_result = colorGetterUniform(temp);\n"
																	  "result = ";

		for (unsigned int array_index = 0; array_index < array_size; ++array_index)
		{
			if (variable_type_glsl == "bool")
				result_sstream << "bool(subroutine_result";
			else
				result_sstream << "all(subroutine_result";

			if (array_size > 1)
			{
				result_sstream << "[" << array_index << "]";
			}

			result_sstream << ")";

			if (array_index != (array_size - 1))
			{
				result_sstream << "&& ";
			}
		}

		result_sstream << " == true ? " << variable_type_glsl_as_int << "(1) : " << variable_type_glsl_as_int << "(0);";
	}
	else
	{
		if (array_size > 1)
		{
			DE_ASSERT(array_size == 2);

			result_sstream << variable_type_glsl << " subroutine_result" << variable_type_glsl_array_sstream.str()
						   << " = colorGetterUniform(temp);\n"
							  "\n"
							  "if (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\n"
							  "else\n"
							  "result = "
						   << variable_type_glsl << "(-1);\n";
		}
		else
		{
			result_sstream << "result = colorGetterUniform(temp);\n";
		}
	}

	/* All done */
	result_sstream << "}\n";

	return result_sstream.str();
}